

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QChar __thiscall QVariant::toChar(QVariant *this)

{
  QChar QVar1;
  undefined6 in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffe;
  
  QVar1 = qvariant_cast<QChar>
                    ((QVariant *)CONCAT26(in_stack_fffffffffffffffe,in_stack_fffffffffffffff8));
  return (QChar)QVar1.ucs;
}

Assistant:

QChar QVariant::toChar() const
{
    return qvariant_cast<QChar>(*this);
}